

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O2

string * __thiscall
license::locate::EnvironmentVarData::retrieve_license_content
          (string *__return_storage_ptr__,EnvironmentVarData *this,string *licenseLocation)

{
  char *pcVar1;
  string *str;
  string env_val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator local_49;
  string local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  pcVar1 = getenv("LICENSE_LOCATION");
  std::__cxx11::string::string((string *)&local_48,pcVar1,(allocator *)&local_28);
  if (this->isBase64 == true) {
    unbase64((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&local_48);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (char *)local_28._M_impl.super__Vector_impl_data._M_start,&local_49);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_48._M_string_length;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

const std::string EnvironmentVarData::retrieve_license_content(const std::string &licenseLocation) const {
	string env_val = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
	if (isBase64) {
		vector<uint8_t> data = unbase64(env_val);
		string str = string(reinterpret_cast<char *>(data.data()));
		return str;
	}
	return env_val;
}